

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O2

void __thiscall lunasvg::SVGElement::setAttributes(SVGElement *this,AttributeList *attributes)

{
  while (attributes = (AttributeList *)((_Fwd_list_node_base *)attributes)->_M_next,
        (_Fwd_list_impl)attributes != (_Fwd_list_impl)0x0) {
    setAttribute(this,(Attribute *)((long)attributes + 8));
  }
  return;
}

Assistant:

void SVGElement::setAttributes(const AttributeList& attributes)
{
    for(const auto& attribute : attributes) {
        setAttribute(attribute);
    }
}